

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

Value * __thiscall toml::internal::Parser::parseGroupKey(Parser *this,Value *root)

{
  TokenType TVar1;
  bool bVar2;
  Type TVar3;
  Value *pVVar4;
  size_t sVar5;
  Value local_a0;
  TokenType local_8c;
  undefined1 local_88 [8];
  _Rb_tree_node_base _Stack_80;
  size_t local_60;
  string key;
  
  bVar2 = consumeForKey(this,LBRACKET);
  if (bVar2) {
    local_8c = (this->token_).type_;
    if (local_8c == LBRACKET) {
      nextKey(this);
    }
    while ((this->token_).type_ - IDENT < 2) {
      std::__cxx11::string::string((string *)&key,(string *)&(this->token_).str_value_);
      nextKey(this);
      TVar1 = (this->token_).type_;
      if (TVar1 != DOT) {
        if (TVar1 != RBRACKET) goto LAB_0016aef3;
        nextKey(this);
        pVVar4 = Value::findChild(root,&key);
        if (pVVar4 == (Value *)0x0) {
          if (local_8c == LBRACKET) {
            local_88 = (undefined1  [8])0x0;
            _Stack_80._0_8_ = (pointer)0x0;
            _Stack_80._M_parent = (_Base_ptr)0x0;
            Value::Value(&local_a0,(Array *)local_88);
            pVVar4 = Value::setChild(root,&key,&local_a0);
            Value::~Value(&local_a0);
            std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector
                      ((vector<toml::Value,_std::allocator<toml::Value>_> *)local_88);
            local_88 = (undefined1  [8])0x0;
            _Stack_80._0_8_ = (pointer)0x0;
            _Stack_80._M_parent = (_Base_ptr)0x0;
            _Stack_80._M_left = &_Stack_80;
            local_60 = 0;
            _Stack_80._M_right = _Stack_80._M_left;
            Value::Value(&local_a0,(Table *)local_88);
            pVVar4 = Value::push(pVVar4,&local_a0);
          }
          else {
            local_88 = (undefined1  [8])0x0;
            _Stack_80._0_8_ = (pointer)0x0;
            _Stack_80._M_parent = (_Base_ptr)0x0;
            _Stack_80._M_left = &_Stack_80;
            local_60 = 0;
            _Stack_80._M_right = _Stack_80._M_left;
            Value::Value(&local_a0,(Table *)local_88);
            pVVar4 = Value::setChild(root,&key,&local_a0);
          }
        }
        else {
          TVar3 = pVVar4->type_;
          if (local_8c != LBRACKET) {
            if (TVar3 == ARRAY_TYPE) {
              sVar5 = Value::size(pVVar4);
              if (sVar5 != 0) {
                sVar5 = Value::size(pVVar4);
                pVVar4 = Value::find(pVVar4,sVar5 - 1);
              }
              TVar3 = pVVar4->type_;
            }
            if (TVar3 != TABLE_TYPE) goto LAB_0016aef3;
            goto LAB_0016af66;
          }
          if (TVar3 != ARRAY_TYPE) {
LAB_0016aef3:
            std::__cxx11::string::~string((string *)&key);
            return (Value *)0x0;
          }
          local_88 = (undefined1  [8])0x0;
          _Stack_80._0_8_ = (pointer)0x0;
          _Stack_80._M_parent = (_Base_ptr)0x0;
          _Stack_80._M_left = &_Stack_80;
          local_60 = 0;
          _Stack_80._M_right = _Stack_80._M_left;
          Value::Value(&local_a0,(Table *)local_88);
          pVVar4 = Value::push(pVVar4,&local_a0);
        }
        Value::~Value(&local_a0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                     *)local_88);
LAB_0016af66:
        std::__cxx11::string::~string((string *)&key);
        if ((local_8c == LBRACKET) && (bVar2 = consumeForKey(this,RBRACKET), !bVar2)) {
          return (Value *)0x0;
        }
        bVar2 = consumeEOLorEOFForKey(this);
        if (bVar2) {
          return pVVar4;
        }
        return (Value *)0x0;
      }
      nextKey(this);
      pVVar4 = Value::findChild(root,&key);
      if (pVVar4 == (Value *)0x0) {
        local_88 = (undefined1  [8])0x0;
        _Stack_80._0_8_ = (pointer)0x0;
        _Stack_80._M_parent = (_Base_ptr)0x0;
        _Stack_80._M_left = &_Stack_80;
        local_60 = 0;
        _Stack_80._M_right = _Stack_80._M_left;
        Value::Value(&local_a0,(Table *)local_88);
        root = Value::setChild(root,&key,&local_a0);
        Value::~Value(&local_a0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                     *)local_88);
      }
      else {
        TVar3 = pVVar4->type_;
        if (TVar3 == ARRAY_TYPE) {
          sVar5 = Value::size(pVVar4);
          if (sVar5 != 0) {
            sVar5 = Value::size(pVVar4);
            pVVar4 = Value::find(pVVar4,sVar5 - 1);
          }
          TVar3 = pVVar4->type_;
        }
        root = pVVar4;
        if (TVar3 != TABLE_TYPE) goto LAB_0016aef3;
      }
      std::__cxx11::string::~string((string *)&key);
    }
  }
  return (Value *)0x0;
}

Assistant:

inline Value* Parser::parseGroupKey(Value* root)
{
    if (!consumeForKey(TokenType::LBRACKET))
        return nullptr;

    bool isArray = false;
    if (token().type() == TokenType::LBRACKET) {
        nextKey();
        isArray = true;
    }

    Value* currentValue = root;
    while (true) {
        if (token().type() != TokenType::IDENT && token().type() != TokenType::STRING)
            return nullptr;

        std::string key = token().strValue();
        nextKey();

        if (token().type() == TokenType::DOT) {
            nextKey();
            if (Value* candidate = currentValue->findChild(key)) {
                if (candidate->is<Array>() && candidate->size() > 0)
                    candidate = candidate->find(candidate->size() - 1);
                if (!candidate->is<Table>())
                    return nullptr;
                currentValue = candidate;
            } else {
                currentValue = currentValue->setChild(key, Table());
            }
            continue;
        }

        if (token().type() == TokenType::RBRACKET) {
            nextKey();
            if (Value* candidate = currentValue->findChild(key)) {
                if (isArray) {
                    if (!candidate->is<Array>())
                        return nullptr;
                    currentValue = candidate->push(Table());
                } else {
                    if (candidate->is<Array>() && candidate->size() > 0)
                        candidate = candidate->find(candidate->size() - 1);
                    if (!candidate->is<Table>())
                        return nullptr;
                    currentValue = candidate;
                }
            } else {
                if (isArray) {
                    currentValue = currentValue->setChild(key, Array());
                    currentValue = currentValue->push(Table());
                } else {
                    currentValue = currentValue->setChild(key, Table());
                }
            }
            break;
        }

        return nullptr;
    }

    if (isArray) {
        if (!consumeForKey(TokenType::RBRACKET))
            return nullptr;
    }

    if (!consumeEOLorEOFForKey())
        return nullptr;

    return currentValue;
}